

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdCelsiusVtxAttrShort::emulate_mthd(MthdCelsiusVtxAttrShort *this)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  bool bVar4;
  uint uVar5;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar5 = 0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      uVar3 = pgraph_idx_short_to_float
                        (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                         (int16_t)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val <<
                                   (0x30U - (char)(uVar5 << 4) & 0x3f)) >> 0x30));
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [(int)(this->which * 4 +
             *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 * 2 | uVar5)] =
           uVar3;
      uVar5 = 1;
      bVar2 = false;
    } while (bVar4);
    if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 0) {
      iVar1 = this->which;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_xfrm
      [(long)iVar1 + -7][2] = 0;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [iVar1 * 4 + 3] = 0x3f800000;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				int16_t v = extrs(val, i * 16, 16);
				exp.celsius_pipe_vtx[which * 4 + idx * 2 + i] = pgraph_idx_short_to_float(&exp, v);
			}
			if (idx == 0) {
				exp.celsius_pipe_vtx[which * 4 + 2] = 0;
				exp.celsius_pipe_vtx[which * 4 + 3] = 0x3f800000;
			}
		}
	}